

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O1

void __thiscall bitdeque<32768>::push_back(bitdeque<32768> *this,bool val)

{
  undefined7 in_register_00000031;
  ulong uVar1;
  long in_FS_OFFSET;
  _Map_pointer local_38;
  byte local_30;
  _Elt_pointer local_28;
  
  local_28 = *(_Elt_pointer *)(in_FS_OFFSET + 0x28);
  extend_back(this,1);
  back((bitdeque<32768> *)&stack0xffffffffffffffc8);
  uVar1 = 1L << (local_30 & 0x3f);
  if ((int)CONCAT71(in_register_00000031,val) == 0) {
    *local_38 = (bitset<32768UL> *)((ulong)*local_38 & ~uVar1);
  }
  else {
    *local_38 = (bitset<32768UL> *)((ulong)*local_38 | uVar1);
  }
  if (*(_Elt_pointer *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void push_back(bool val)
    {
        extend_back(1);
        back() = val;
    }